

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

bool __thiscall GlobOptBlockData::IsSwitchInt32TypeSpecialized(GlobOptBlockData *this,Instr *instr)

{
  bool bVar1;
  Func *func;
  Opnd *pOVar2;
  RegOpnd *pRVar3;
  bool local_19;
  Instr *instr_local;
  GlobOptBlockData *this_local;
  
  func = Func::GetTopFunc(instr->m_func);
  bVar1 = GlobOpt::IsSwitchOptEnabledForIntTypeSpec(func);
  local_19 = false;
  if (bVar1) {
    pOVar2 = IR::Instr::GetSrc1(instr);
    bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
    local_19 = false;
    if (bVar1) {
      pOVar2 = IR::Instr::GetSrc1(instr);
      pRVar3 = IR::Opnd::AsRegOpnd(pOVar2);
      local_19 = IsInt32TypeSpecialized(this,&pRVar3->m_sym->super_Sym);
    }
  }
  return local_19;
}

Assistant:

bool
GlobOptBlockData::IsSwitchInt32TypeSpecialized(IR::Instr const * instr) const
{
    return GlobOpt::IsSwitchOptEnabledForIntTypeSpec(instr->m_func->GetTopFunc())
        && instr->GetSrc1()->IsRegOpnd()
        && this->IsInt32TypeSpecialized(instr->GetSrc1()->AsRegOpnd()->m_sym);
}